

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_disk_io.cpp
# Opt level: O0

void __thiscall
libtorrent::posix_disk_io::posix_disk_io
          (posix_disk_io *this,io_context *ios,settings_interface *sett,counters *cnt)

{
  counters *cnt_local;
  settings_interface *sett_local;
  io_context *ios_local;
  posix_disk_io *this_local;
  
  disk_interface::disk_interface(&this->super_disk_interface);
  (this->super_disk_interface)._vptr_disk_interface = (_func_int **)&PTR_new_torrent_00b8ed18;
  libtorrent::aux::
  container_wrapper<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>,_libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_std::vector<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>,_std::allocator<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>_>_>_>
  ::container_wrapper(&this->m_torrents);
  libtorrent::aux::storage_free_list::storage_free_list(&this->m_free_slots);
  this->m_settings = sett;
  libtorrent::aux::disk_buffer_pool::disk_buffer_pool(&this->m_buffer_pool,ios);
  this->m_stats_counters = cnt;
  this->m_ios = ios;
  settings_updated(this);
  return;
}

Assistant:

posix_disk_io(io_context& ios, settings_interface const& sett, counters& cnt)
			: m_settings(sett)
			, m_buffer_pool(ios)
			, m_stats_counters(cnt)
			, m_ios(ios)
		{
			settings_updated();
		}